

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdPatternColorR5G5B5::emulate_mthd(MthdPatternColorR5G5B5 *this)

{
  byte bVar1;
  uint32_t uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  
  uVar2 = nv04_pgraph_hswap(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                            (this->super_SingleMthdTest).super_MthdTest.val);
  uVar4 = (ulong)uVar2;
  iVar5 = 0;
  for (lVar3 = 0x3b; lVar3 != 0x1b; lVar3 = lVar3 + -0x10) {
    bVar1 = (byte)lVar3;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.pattern_color
    [iVar5 + *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 * 2] =
         (uint)((uVar4 << (bVar1 - 10 & 0x3f)) >> 0x3b) * 0x84000 & 0xff0000 |
         (uint)((uVar4 << (bVar1 - 5 & 0x3f)) >> 0x3b) * 0x840 & 0xff00 |
         (uint)((uVar4 << (bVar1 & 0x3f)) >> 0x3b) * 0x21 >> 2;
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t rval = nv04_pgraph_hswap(&exp, val);
		for (int i = 0; i < 2; i++) {
			uint8_t b = extr(rval, i * 16 + 0, 5) * 0x21 >> 2;
			uint8_t g = extr(rval, i * 16 + 5, 5) * 0x21 >> 2;
			uint8_t r = extr(rval, i * 16 + 10, 5) * 0x21 >> 2;
			exp.pattern_color[idx*2+i] = b | g << 8 | r << 16;
		}
	}